

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O2

void rtrim(char *str)

{
  size_t sVar1;
  
  for (sVar1 = strlen(str); (0 < (long)sVar1 && (str[sVar1 - 1] == ' ')); sVar1 = sVar1 - 1) {
    str[sVar1 - 1] = '\0';
  }
  return;
}

Assistant:

static void rtrim(char *str)
{
    long length;

    length = (long)strlen(str);
    while (length > 0 && str[length - 1] == ' ')
    {
        str[length - 1] = '\0';
        length--;
    }
}